

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O3

void errortests(void)

{
  int iVar1;
  FILE *__stream;
  double *pdVar2;
  double *predicted;
  long lVar3;
  int length;
  double local_25a8;
  double temp [1200];
  
  __stream = fopen("../data/eusm.txt","r");
  if (__stream != (FILE *)0x0) {
    iVar1 = feof(__stream);
    length = -100;
    if (iVar1 == 0) {
      pdVar2 = &local_25a8;
      do {
        __isoc99_fscanf(__stream,"%lf \n",pdVar2);
        iVar1 = feof(__stream);
        pdVar2 = pdVar2 + 1;
        length = length + 1;
      } while (iVar1 == 0);
    }
    pdVar2 = (double *)malloc(800);
    predicted = (double *)malloc(800);
    memcpy(pdVar2,temp + 199,800);
    lVar3 = 0;
    do {
      predicted[lVar3] = 1716.18;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 100);
    me(predicted,pdVar2,100);
    printf("Mean Error %g \n");
    mse(predicted,pdVar2,100);
    printf("Mean Squared Error %g \n");
    rmse(predicted,pdVar2,100);
    printf("Root Mean Squared Error %g \n");
    mae(predicted,pdVar2,100);
    printf("Mean Absolute Error %g \n");
    mpe(predicted,pdVar2,100);
    printf("Mean Percentage Error %g \n");
    mape(predicted,pdVar2,100);
    printf("Mean Absolute Percentage Error %g \n");
    mase(predicted,pdVar2,100,&local_25a8,length);
    printf("Mean Absolute Scaled Error %g \n");
    free(pdVar2);
    free(predicted);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void errortests() {
    double *predicted, *actual;
    int N,i,M;
    FILE *ifp;
	double temp[1200];

    ifp = fopen("../data/eusm.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}

    M = i;
    N = 100;


    actual = (double*) malloc(sizeof(double)*N);
    predicted = (double*) malloc(sizeof(double)*N);

    for(i = 0; i < N;++i) {
        predicted[i] = 1716.18;
        actual[i] = temp[200+i];
    }

    printf("Mean Error %g \n",me(predicted,actual,N));
    printf("Mean Squared Error %g \n",mse(predicted,actual,N));
    printf("Root Mean Squared Error %g \n",rmse(predicted,actual,N));
    printf("Mean Absolute Error %g \n",mae(predicted,actual,N));
    printf("Mean Percentage Error %g \n",mpe(predicted,actual,N));
    printf("Mean Absolute Percentage Error %g \n",mape(predicted,actual,N));
    printf("Mean Absolute Scaled Error %g \n",mase(predicted,actual,N,temp,M-N));

    free(actual);
    free(predicted);
}